

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.cpp
# Opt level: O2

double __thiscall wasm::Random::getDouble(Random *this)

{
  anon_union_16_6_1532cd5a_for_Literal_0 local_30;
  undefined8 local_20;
  double local_18;
  
  local_30.i64 = get64(this);
  local_20 = 3;
  local_18 = Literal::reinterpretf64((Literal *)&local_30.func);
  wasm::Literal::~Literal((Literal *)&local_30.func);
  return local_18;
}

Assistant:

double Random::getDouble() { return Literal(get64()).reinterpretf64(); }